

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::displayHand(Player *this,int row)

{
  pointer ppCVar1;
  ostream *poVar2;
  pointer ppCVar3;
  Erase local_3c;
  Cursor local_34;
  
  AdvancedConsole::Cursor::Cursor(&local_34,row,0,AC_ABSOLUTE);
  poVar2 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_34);
  AdvancedConsole::Erase::Erase(&local_3c,AC_ALL,AC_LINE);
  poVar2 = AdvancedConsole::operator<<(poVar2,&local_3c);
  std::operator<<(poVar2,"Your Hand: ");
  ppCVar1 = (this->_hand).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar3 = (this->_hand).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar3 != ppCVar1; ppCVar3 = ppCVar3 + 1) {
    poVar2 = operator<<((ostream *)&std::cout,*ppCVar3);
    std::operator<<(poVar2,"  ");
  }
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Player::displayHand(int row) {
    cout << AdvancedConsole::Cursor(row, 0) << AdvancedConsole::Erase(AdvancedConsole::AC_ALL, AdvancedConsole::AC_LINE)
         << "Your Hand: ";
    for (Card *c: _hand) {
        cout << *c << "  ";
    }
    cout << endl << endl;

}